

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BayesianProbitRegressionValidatorTests.cpp
# Opt level: O3

int testBayesianProbitRegressionValidationBasic(void)

{
  bool bVar1;
  ArrayFeatureType *this;
  Rep *pRVar2;
  FeatureType *this_00;
  ArrayFeatureType *this_01;
  FeatureType *this_02;
  ModelDescription *this_03;
  Type *pTVar3;
  Type *pTVar4;
  ostream *poVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  RepeatedField<long> *this_04;
  Result result;
  Model model;
  undefined1 local_b0 [8];
  _Alloc_hider local_a8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_98;
  Model local_88;
  undefined1 local_58 [8];
  _Alloc_hider local_50;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_40;
  
  this = (ArrayFeatureType *)operator_new(0x48);
  CoreML::Specification::ArrayFeatureType::ArrayFeatureType(this);
  this_04 = &this->shape_;
  iVar8 = (this->shape_).current_size_;
  iVar6 = (this->shape_).total_size_;
  if (iVar8 == iVar6) {
    google::protobuf::RepeatedField<long>::Reserve(this_04,iVar8 + 1);
    iVar8 = (this->shape_).current_size_;
    iVar6 = (this->shape_).total_size_;
  }
  pRVar2 = (this->shape_).rep_;
  iVar7 = iVar8 + 1;
  (this->shape_).current_size_ = iVar7;
  pRVar2->elements[iVar8] = 10;
  if (iVar7 == iVar6) {
    google::protobuf::RepeatedField<long>::Reserve(this_04,iVar8 + 2);
    iVar7 = (this->shape_).current_size_;
    pRVar2 = (this->shape_).rep_;
  }
  this_04->current_size_ = iVar7 + 1;
  pRVar2->elements[iVar7] = 10;
  this_00 = (FeatureType *)operator_new(0x28);
  CoreML::Specification::FeatureType::FeatureType(this_00);
  CoreML::Specification::FeatureType::clear_Type(this_00);
  this_00->_oneof_case_[0] = 5;
  (this_00->Type_).multiarraytype_ = this;
  this_01 = (ArrayFeatureType *)operator_new(0x48);
  CoreML::Specification::ArrayFeatureType::ArrayFeatureType(this_01);
  iVar8 = (this_01->shape_).current_size_;
  if (iVar8 == (this_01->shape_).total_size_) {
    google::protobuf::RepeatedField<long>::Reserve(&this_01->shape_,iVar8 + 1);
    iVar8 = (this_01->shape_).current_size_;
  }
  (this_01->shape_).current_size_ = iVar8 + 1;
  ((this_01->shape_).rep_)->elements[iVar8] = 10;
  this_02 = (FeatureType *)operator_new(0x28);
  CoreML::Specification::FeatureType::FeatureType(this_02);
  CoreML::Specification::FeatureType::clear_Type(this_02);
  this_02->_oneof_case_[0] = 5;
  (this_02->Type_).multiarraytype_ = this_01;
  this_03 = (ModelDescription *)operator_new(0x78);
  CoreML::Specification::ModelDescription::ModelDescription(this_03);
  pTVar3 = google::protobuf::internal::RepeatedPtrFieldBase::
           Add<google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::TypeHandler>
                     (&(this_03->input_).super_RepeatedPtrFieldBase,(Type *)0x0);
  pTVar4 = google::protobuf::internal::RepeatedPtrFieldBase::
           Add<google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::TypeHandler>
                     (&(this_03->output_).super_RepeatedPtrFieldBase,(Type *)0x0);
  if (pTVar3->type_ != (FeatureType *)0x0) {
    (*(pTVar3->type_->super_MessageLite)._vptr_MessageLite[1])();
  }
  pTVar3->type_ = this_00;
  if (pTVar4->type_ != (FeatureType *)0x0) {
    (*(pTVar4->type_->super_MessageLite)._vptr_MessageLite[1])();
  }
  pTVar4->type_ = this_02;
  CoreML::Specification::Model::Model(&local_88);
  if (local_88.description_ != (ModelDescription *)0x0) {
    (*((local_88.description_)->super_MessageLite)._vptr_MessageLite[1])();
  }
  local_88.description_ = this_03;
  CoreML::validate<(MLModelType)304>((Result *)local_b0,&local_88);
  bVar1 = CoreML::Result::good((Result *)local_b0);
  if (bVar1) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/mlmodel/tests/BayesianProbitRegressionValidatorTests.cpp"
               ,0x82);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,":",1);
    poVar5 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,0x2b);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,": error: ",9);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"!((result).good())",0x12);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5," was false, expected true.",0x1a);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
  }
  else {
    this->datatype_ = 0x20020;
    CoreML::validate<(MLModelType)304>((Result *)local_58,&local_88);
    local_b0 = local_58;
    std::__cxx11::string::operator=((string *)&local_a8,(string *)&local_50);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_p != &local_40) {
      operator_delete(local_50._M_p,local_40._M_allocated_capacity + 1);
    }
    bVar1 = CoreML::Result::good((Result *)local_b0);
    iVar8 = 0;
    if (bVar1) goto LAB_00140a81;
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/mlmodel/tests/BayesianProbitRegressionValidatorTests.cpp"
               ,0x82);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,":",1);
    poVar5 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,0x30);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,": error: ",9);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"(result).good()",0xf);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5," was false, expected true.",0x1a);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
  }
  std::ostream::put((char)poVar5);
  iVar8 = 1;
  std::ostream::flush();
LAB_00140a81:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a8._M_p != &local_98) {
    operator_delete(local_a8._M_p,local_98._M_allocated_capacity + 1);
  }
  CoreML::Specification::Model::~Model(&local_88);
  return iVar8;
}

Assistant:

int testBayesianProbitRegressionValidationBasic () {

    Specification::ArrayFeatureType* inputArrayFeatureType = new Specification::ArrayFeatureType();
    inputArrayFeatureType->add_shape(10);
    inputArrayFeatureType->add_shape(10);

    Specification::FeatureType* inputFeatureType = new Specification::FeatureType();
    inputFeatureType->set_allocated_multiarraytype(inputArrayFeatureType);

    Specification::ArrayFeatureType* outputArrayFeatureType = new Specification::ArrayFeatureType();
    outputArrayFeatureType->add_shape(10);

    Specification::FeatureType* outputFeatureType = new Specification::FeatureType();
    outputFeatureType->set_allocated_multiarraytype(outputArrayFeatureType);

    Specification::ModelDescription* description = new Specification::ModelDescription();
    Specification::FeatureDescription* input = description->add_input();
    Specification::FeatureDescription* output = description->add_output();
    input->set_allocated_type(inputFeatureType);
    output->set_allocated_type(outputFeatureType);

    Specification::Model model;
    model.set_allocated_description(description);

    Result result = validate<MLModelType_bayesianProbitRegressor>(model);
    ML_ASSERT_BAD(result);

    inputArrayFeatureType->set_datatype(Specification::ArrayFeatureType_ArrayDataType_INT32);

    result = validate<MLModelType_bayesianProbitRegressor>(model);
    ML_ASSERT_GOOD(result);

    return 0;
}